

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedChargeAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::FixedChargeAdapter::makeFixedCharge(FixedChargeAdapter *this,RealType charge)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_48 [40];
  RealType local_20;
  
  bVar1 = isFixedCharge(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::FCtypeID_abi_cxx11_);
  }
  this_00 = this->at_;
  local_20 = charge;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,std::__cxx11::string_const&,OpenMD::FixedChargeAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (FixedChargeAtypeParameters *)OpenMD::FCtypeID_abi_cxx11_);
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

void FixedChargeAdapter::makeFixedCharge(RealType charge) {
    if (isFixedCharge()) { at_->removeProperty(FCtypeID); }

    FixedChargeAtypeParameters fcParam {};
    fcParam.charge = charge;

    at_->addProperty(std::make_shared<FixedChargeAtypeData>(FCtypeID, fcParam));
  }